

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atomic_guarded.hpp
# Opt level: O3

atomic_guarded<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::mutex>
* __thiscall
gmlc::libguarded::atomic_guarded<std::__cxx11::string,std::mutex>::operator=
          (atomic_guarded<std::__cxx11::string,std::mutex> *this,char (*newObj) [19])

{
  char *pcVar1;
  int iVar2;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)(this + 0x20));
  if (iVar2 == 0) {
    pcVar1 = *(char **)(this + 8);
    strlen(*newObj);
    std::__cxx11::string::_M_replace((ulong)this,0,pcVar1,(ulong)newObj);
    pthread_mutex_unlock((pthread_mutex_t *)(this + 0x20));
    return (atomic_guarded<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::mutex>
            *)this;
  }
  std::__throw_system_error(iVar2);
}

Assistant:

atomic_guarded& operator=(objType&& newObj)
    {  // uses a forwarding reference
        std::lock_guard<M> glock(m_mutex);
        m_obj = std::forward<objType>(newObj);
        return *this;
    }